

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCompanionObject
          (KotlinKMPGenerator *this,CodeWriter *code,function<void_()> *callback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  string local_60;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"companion object {","");
  CodeWriter::operator+=(code,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  code->cur_ident_lvl_ = code->cur_ident_lvl_ + 1;
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*callback->_M_invoker)((_Any_data *)callback);
    if (code->cur_ident_lvl_ != 0) {
      code->cur_ident_lvl_ = code->cur_ident_lvl_ + -1;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"}","");
    CodeWriter::operator+=(code,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void GenerateCompanionObject(CodeWriter &code,
                               const std::function<void()> &callback) const {
    code += "companion object {";
    code.IncrementIdentLevel();
    callback();
    code.DecrementIdentLevel();
    code += "}";
  }